

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O3

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  randomx_cache *cache;
  JitCompilerX86 *pJVar1;
  uint8_t *puVar2;
  undefined *puVar3;
  size_type sVar4;
  char cVar5;
  size_t __n;
  long unaff_RBP;
  randomx_cache *__s;
  uint *puVar6;
  ulong uVar7;
  code *pcVar8;
  
  if ((flags & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((flags & RANDOMX_FLAG_ARGON2_SSSE3) != RANDOMX_FLAG_DEFAULT) {
      pcVar8 = randomx_argon2_impl_ssse3();
      goto LAB_0011e5e5;
    }
    pcVar8 = randomx_argon2_fill_segment_ref;
  }
  else {
    pcVar8 = randomx_argon2_impl_avx2();
LAB_0011e5e5:
    if ((Instruction)pcVar8 == (Instruction)0x0) {
      return (randomx_cache *)0x0;
    }
  }
  cache = (randomx_cache *)operator_new(0x83a8);
  puVar6 = (uint *)&(cache->cacheKey).field_2;
  __s = cache;
  memset(cache,0,0x83a0);
  (cache->cacheKey)._M_dataplus._M_p = (pointer)puVar6;
  (cache->cacheKey).field_2._M_local_buf[0] = '\0';
  cache->argonImpl = pcVar8;
  uVar7 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
  cVar5 = (char)((long)&switchD_0011e641::switchdataD_0012d9a0 +
                (long)(int)(&switchD_0011e641::switchdataD_0012d9a0)[uVar7]);
  switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
  case RANDOMX_FLAG_DEFAULT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    break;
  case RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    cache->jit = (JitCompiler *)0x0;
    cache->initialize = randomx::initCache;
    cache->datasetInit = randomx::initDataset;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    break;
  default:
    operator_delete(puVar6);
    if ((int)__n == 1) {
      __cxa_begin_catch(&switchD_0011e641::switchdataD_0012d9a0);
      if (cache != (randomx_cache *)0x0) {
        randomx_release_cache(cache);
      }
      __cxa_end_catch();
      return (randomx_cache *)0x0;
    }
    _Unwind_Resume(&switchD_0011e641::switchdataD_0012d9a0);
  case RANDOMX_FLAG_JIT:
    cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
    puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
    cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
    pJVar1 = (JitCompilerX86 *)operator_new(0x48);
    randomx::JitCompilerX86::JitCompilerX86(pJVar1);
    cache->jit = pJVar1;
    cache->initialize = randomx::initCacheCompile;
    cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
    puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
    break;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
    if ((ulong)((long)&switchD_0011e641::switchdataD_0012d9a0 +
               (long)(int)(&switchD_0011e641::switchdataD_0012d9a0)[uVar7]) < 2) {
      return (randomx_cache *)(ulong)*(uint *)&__s->memory;
    }
    memset(__s,0,__n);
    cache[1].programs[0].programBuffer[0x139] = (Instruction)pcVar8;
    cache[1].programs[0].programBuffer[0x13b].opcode = '\0';
    puVar3 = &randomx::InterpretedLightVm<randomx::AlignedAllocator<64ul>,true>::vtable;
    goto LAB_0011ee88;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = cVar5 + '\x14';
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
    switchD_0011e641::switchdataD_0012d9a0._0_1_ = 0x43;
    puVar6 = &switchD_0011e641::switchdataD_0012d9a0;
    memset(&switchD_0011e641::switchdataD_0012d9a0,0,0xac0);
    randomx::CompiledVm<randomx::LargePageAllocator,_true,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_true,_false> *)
               &switchD_0011e641::switchdataD_0012d9a0);
    puVar3 = &randomx::CompiledLightVm<randomx::LargePageAllocator,true,false>::vtable;
    goto LAB_0011ee88;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
    *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + -0x60;
    lutDec3._1014_4_ = 0x5c6cd571;
    halt_baddata();
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
    switchD_0011e641::switchdataD_0012d9a0._0_1_ = 0x43;
    puVar6 = &switchD_0011e641::switchdataD_0012d9a0;
    memset(&switchD_0011e641::switchdataD_0012d9a0,0,0xac0);
    randomx::CompiledVm<randomx::LargePageAllocator,_false,_false>::CompiledVm
              ((CompiledVm<randomx::LargePageAllocator,_false,_false> *)
               &switchD_0011e641::switchdataD_0012d9a0);
    puVar3 = &randomx::CompiledLightVm<randomx::LargePageAllocator,false,false>::vtable;
LAB_0011ee88:
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity = (size_type)(puVar3 + 0x10);
    sVar4 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity;
    if (uVar7 != 0) {
      (**(code **)(sVar4 + 0x30))(puVar6,uVar7);
      std::__cxx11::string::_M_assign
                ((string *)(((randomx_cache *)puVar6)->programs[0].programBuffer + 0x13c));
      sVar4 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity;
    }
    if (cache != (randomx_cache *)0x0) {
      (**(code **)(sVar4 + 0x28))(puVar6,cache);
      sVar4 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)&((randomx_cache *)puVar6)->memory)->_M_allocated_capacity;
    }
    (**(code **)(sVar4 + 0x10))(puVar6);
    return (randomx_cache *)puVar6;
  case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
    lutDec3[0xe2]._1_1_ = cVar5 + '\x14';
    halt_baddata();
  }
  cache->memory = puVar2;
  return cache;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}